

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

void Vec_QuePush(Vec_Que_t *p,int v)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = p->nCap;
  if (iVar4 <= p->nSize) {
    iVar3 = p->nSize + 1;
    iVar1 = iVar4 * 2;
    if (iVar4 * 2 < iVar3) {
      iVar1 = iVar3;
    }
    Vec_QueGrow(p,iVar1);
    iVar4 = p->nCap;
  }
  if (iVar4 <= v) {
    iVar3 = v + 1;
    iVar1 = iVar4 * 2;
    if (iVar3 != iVar1 && SBORROW4(iVar3,iVar1) == iVar3 + iVar4 * -2 < 0) {
      iVar1 = iVar3;
    }
    Vec_QueGrow(p,iVar1);
    iVar4 = p->nCap;
  }
  iVar1 = p->nSize;
  if (iVar4 <= iVar1) {
    __assert_fail("p->nSize < p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  if (p->pOrder[v] != -1) {
    __assert_fail("p->pOrder[v] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar2 = p->pHeap;
  if (piVar2[iVar1] == -1) {
    p->pOrder[v] = iVar1;
    iVar4 = p->nSize;
    p->nSize = iVar4 + 1;
    piVar2[iVar4] = v;
    Vec_QueMoveUp(p,v);
    return;
  }
  __assert_fail("p->pHeap[p->nSize] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
}

Assistant:

static inline void Vec_QuePush( Vec_Que_t * p, int v )
{
    if ( p->nSize >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(p->nSize+1, 2*p->nCap) );
    if ( v >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(v+1, 2*p->nCap) );
    assert( p->nSize < p->nCap );
    assert( p->pOrder[v] == -1 );
    assert( p->pHeap[p->nSize] == -1 );
    p->pOrder[v] = p->nSize;
    p->pHeap[p->nSize++] = v;
    Vec_QueMoveUp( p, v );
}